

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O2

FIOBJ fiobj_float_new(double num)

{
  undefined1 *puVar1;
  int *piVar2;
  
  puVar1 = (undefined1 *)fio_malloc(0x10);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x27;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(double *)(puVar1 + 8) = num;
    return (FIOBJ)puVar1;
  }
  perror("ERROR: fiobj float couldn\'t allocate memory");
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

FIOBJ fiobj_float_new(double num) {
  fiobj_float_s *o = fio_malloc(sizeof(*o));
  if (!o) {
    perror("ERROR: fiobj float couldn't allocate memory");
    exit(errno);
  }
  *o = (fiobj_float_s){
      .head =
          {
              .type = FIOBJ_T_FLOAT,
              .ref = 1,
          },
      .f = num,
  };
  return (FIOBJ)o;
}